

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O1

void apply_imputation_results<PredictionData<float,unsigned_long>,ImputedData<unsigned_long,long_double>>
               (PredictionData<float,_unsigned_long> *prediction_data,
               ImputedData<unsigned_long,_long_double> *imp,Imputer *imputer,size_t row)

{
  longdouble lVar1;
  longdouble lVar2;
  bool bVar3;
  pointer puVar4;
  pointer plVar5;
  pointer plVar6;
  pointer pdVar7;
  float *pfVar8;
  long lVar9;
  ulong uVar10;
  pointer pvVar11;
  pointer pvVar12;
  int *piVar13;
  pointer piVar14;
  unsigned_long uVar15;
  longdouble *plVar16;
  longdouble *plVar17;
  longdouble lVar18;
  size_t sVar19;
  size_t sVar20;
  ulong uVar21;
  size_t sVar22;
  int iVar23;
  long lVar24;
  longdouble *plVar25;
  longdouble *plVar26;
  longdouble *plVar27;
  float fVar28;
  long local_68;
  ushort uStack_60;
  long local_58;
  ushort uStack_50;
  long local_48;
  ushort uStack_40;
  
  bVar3 = prediction_data->is_col_major;
  sVar20 = imp->n_missing_num;
  if (bVar3 == false) {
    if (sVar20 != 0) {
      puVar4 = (imp->missing_num).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      plVar5 = (imp->num_sum).super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
               super__Vector_impl_data._M_start;
      plVar6 = (imp->num_weight).super__Vector_base<long_double,_std::allocator<long_double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pdVar7 = (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar19 = imputer->ncols_numeric;
      pfVar8 = prediction_data->numeric_data;
      lVar24 = 0;
      lVar18 = (longdouble)0;
      do {
        lVar9 = *(long *)((long)puVar4 + lVar24);
        lVar1 = *(longdouble *)((long)plVar6 + lVar24 * 2);
        if (lVar1 <= lVar18) {
LAB_00317dbd:
          fVar28 = (float)pdVar7[lVar9];
        }
        else {
          lVar2 = *(longdouble *)((long)plVar5 + lVar24 * 2);
          uStack_40 = (ushort)((unkuint10)lVar2 >> 0x40);
          local_48 = SUB108(lVar2,0);
          if (((unkuint10)lVar2 & 0x7fff) != 0 &&
              (0x7ffd < (ushort)((uStack_40 & 0x7fff) - 1) || -1 < local_48)) goto LAB_00317dbd;
          if (((lVar2 == lVar18) && (!NAN(lVar2) && !NAN(lVar18))) && (NAN(pdVar7[lVar9])))
          goto LAB_00317dbd;
          fVar28 = (float)(lVar2 / lVar1);
        }
        pfVar8[sVar19 * row + lVar9] = fVar28;
        lVar24 = lVar24 + 8;
        sVar20 = sVar20 - 1;
      } while (sVar20 != 0);
    }
  }
  else if (sVar20 != 0) {
    puVar4 = (imp->missing_num).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    plVar5 = (imp->num_sum).super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
             super__Vector_impl_data._M_start;
    plVar6 = (imp->num_weight).super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl
             .super__Vector_impl_data._M_start;
    pdVar7 = (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar19 = prediction_data->nrows;
    pfVar8 = prediction_data->numeric_data;
    lVar24 = 0;
    lVar18 = (longdouble)0;
    do {
      lVar9 = *(long *)((long)puVar4 + lVar24);
      lVar1 = *(longdouble *)((long)plVar6 + lVar24 * 2);
      if (lVar1 <= lVar18) {
LAB_00317cf1:
        fVar28 = (float)pdVar7[lVar9];
      }
      else {
        lVar2 = *(longdouble *)((long)plVar5 + lVar24 * 2);
        uStack_50 = (ushort)((unkuint10)lVar2 >> 0x40);
        local_58 = SUB108(lVar2,0);
        if (((unkuint10)lVar2 & 0x7fff) != 0 &&
            (0x7ffd < (ushort)((uStack_50 & 0x7fff) - 1) || -1 < local_58)) goto LAB_00317cf1;
        if (((lVar2 == lVar18) && (!NAN(lVar2) && !NAN(lVar18))) && (NAN(pdVar7[lVar9])))
        goto LAB_00317cf1;
        fVar28 = (float)(lVar2 / lVar1);
      }
      pfVar8[row + lVar9 * sVar19] = fVar28;
      lVar24 = lVar24 + 8;
      sVar20 = sVar20 - 1;
    } while (sVar20 != 0);
  }
  pfVar8 = prediction_data->Xr;
  if (pfVar8 != (float *)0x0) {
    uVar21 = prediction_data->Xr_indptr[row];
    uVar10 = prediction_data->Xr_indptr[row + 1];
    if (uVar21 < uVar10) {
      plVar5 = (imp->sp_num_sum).super__Vector_base<long_double,_std::allocator<long_double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      plVar6 = (imp->sp_num_weight).super__Vector_base<long_double,_std::allocator<long_double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar4 = (imp->missing_sp).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pdVar7 = (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar24 = 0;
      do {
        if (0x7f7fffff < (uint)ABS(pfVar8[uVar21])) {
          lVar18 = plVar6[lVar24];
          if (lVar18 <= (longdouble)0) {
LAB_00317eab:
            fVar28 = (float)pdVar7[puVar4[lVar24]];
          }
          else {
            lVar1 = plVar5[lVar24];
            uStack_60 = (ushort)((unkuint10)lVar1 >> 0x40);
            local_68 = SUB108(lVar1,0);
            if (((unkuint10)lVar1 & 0x7fff) != 0 &&
                (0x7ffd < (ushort)((uStack_60 & 0x7fff) - 1) || -1 < local_68)) goto LAB_00317eab;
            fVar28 = (float)(lVar1 / lVar18);
          }
          pfVar8[uVar21] = fVar28;
          lVar24 = lVar24 + 1;
        }
        uVar21 = uVar21 + 1;
      } while (uVar10 != uVar21);
    }
  }
  sVar20 = imp->n_missing_cat;
  if (bVar3 == false) {
    if (sVar20 != 0) {
      puVar4 = (imp->missing_cat).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar24 = row * imputer->ncols_categ;
      pvVar11 = (imp->cat_sum).
                super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      piVar13 = prediction_data->categ_data;
      pvVar12 = (imp->cat_sum).
                super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      piVar14 = (imputer->col_modes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      sVar19 = 0;
      do {
        uVar15 = puVar4[sVar19];
        plVar16 = pvVar11[uVar15].super__Vector_base<long_double,_std::allocator<long_double>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        plVar17 = pvVar11[uVar15].super__Vector_base<long_double,_std::allocator<long_double>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        plVar27 = plVar16 + 1;
        plVar25 = plVar16;
        plVar26 = plVar16;
        if (plVar27 != plVar17 && plVar16 != plVar17) {
          do {
            plVar26 = plVar27;
            if (*plVar27 <= *plVar25) {
              plVar26 = plVar25;
            }
            plVar27 = plVar27 + 1;
            plVar25 = plVar26;
          } while (plVar27 != plVar17);
        }
        iVar23 = (int)((ulong)((long)plVar26 - (long)plVar16) >> 4);
        piVar13[lVar24 + uVar15] = iVar23;
        if (iVar23 == 0) {
          iVar23 = -1;
          if ((plVar16 != plVar17) && (pvVar11 != pvVar12)) {
            if ((longdouble)0 < *plVar16) goto LAB_00318074;
            iVar23 = piVar14[uVar15];
          }
          piVar13[lVar24 + uVar15] = iVar23;
        }
LAB_00318074:
        sVar19 = sVar19 + 1;
      } while (sVar19 != sVar20);
    }
  }
  else if (sVar20 != 0) {
    puVar4 = (imp->missing_cat).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pvVar11 = (imp->cat_sum).
              super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pvVar12 = (imp->cat_sum).
              super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    piVar13 = prediction_data->categ_data;
    sVar19 = prediction_data->nrows;
    piVar14 = (imputer->col_modes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    sVar22 = 0;
    do {
      uVar15 = puVar4[sVar22];
      plVar16 = pvVar11[uVar15].super__Vector_base<long_double,_std::allocator<long_double>_>.
                _M_impl.super__Vector_impl_data._M_start;
      plVar17 = pvVar11[uVar15].super__Vector_base<long_double,_std::allocator<long_double>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      plVar27 = plVar16 + 1;
      plVar25 = plVar16;
      plVar26 = plVar16;
      if (plVar27 != plVar17 && plVar16 != plVar17) {
        do {
          plVar25 = plVar27;
          if (*plVar27 <= *plVar26) {
            plVar25 = plVar26;
          }
          plVar27 = plVar27 + 1;
          plVar26 = plVar25;
        } while (plVar27 != plVar17);
      }
      lVar24 = sVar19 * uVar15;
      iVar23 = (int)((ulong)((long)plVar25 - (long)plVar16) >> 4);
      piVar13[row + lVar24] = iVar23;
      if (iVar23 == 0) {
        iVar23 = -1;
        if ((plVar16 != plVar17) && (pvVar11 != pvVar12)) {
          if ((longdouble)0 < *plVar16) goto LAB_00317fae;
          iVar23 = piVar14[uVar15];
        }
        piVar13[row + lVar24] = iVar23;
      }
LAB_00317fae:
      sVar22 = sVar22 + 1;
    } while (sVar22 != sVar20);
  }
  return;
}

Assistant:

void apply_imputation_results(PredictionData  &prediction_data,
                              ImputedData     &imp,
                              Imputer         &imputer,
                              size_t          row)
{
    size_t col;
    size_t pos = 0;
    if (prediction_data.is_col_major)
    {
        for (size_t ix = 0; ix < imp.n_missing_num; ix++)
        {
            col = imp.missing_num[ix];
            if (imp.num_weight[ix] > 0 && !is_na_or_inf(imp.num_sum[ix]) && !(imp.num_sum[ix] == 0 && std::isnan(imputer.col_means[col])))
                prediction_data.numeric_data[row + col * prediction_data.nrows]
                    =
                imp.num_sum[ix] / imp.num_weight[ix];
            else
                prediction_data.numeric_data[row + col * prediction_data.nrows]
                    =
                imputer.col_means[col];
        }
    }

    else
    {
        for (size_t ix = 0; ix < imp.n_missing_num; ix++)
        {
            col = imp.missing_num[ix];
            if (imp.num_weight[ix] > 0 && !is_na_or_inf(imp.num_sum[ix]) && !(imp.num_sum[ix] == 0 && std::isnan(imputer.col_means[col])))
                prediction_data.numeric_data[col + row * imputer.ncols_numeric]
                    =
                imp.num_sum[ix] / imp.num_weight[ix];
            else
                prediction_data.numeric_data[col + row * imputer.ncols_numeric]
                    =
                imputer.col_means[col];
        }
    }

    if (prediction_data.Xr != NULL)
        for (auto ix = prediction_data.Xr_indptr[row]; ix < prediction_data.Xr_indptr[row + 1]; ix++)
        {
            if (is_na_or_inf(prediction_data.Xr[ix]))
            {
                if (imp.sp_num_weight[pos] > 0 && !is_na_or_inf(imp.sp_num_sum[pos]))
                    prediction_data.Xr[ix]
                        =
                    imp.sp_num_sum[pos] / imp.sp_num_weight[pos];
                else
                    prediction_data.Xr[ix]
                        =
                    imputer.col_means[imp.missing_sp[pos]];
                pos++;
            }
        }

    if (prediction_data.is_col_major)
    {
        for (size_t ix = 0; ix < imp.n_missing_cat; ix++)
        {
            col = imp.missing_cat[ix];
            prediction_data.categ_data[row + col * prediction_data.nrows]
                        =
            std::distance(imp.cat_sum[col].begin(),
                          std::max_element(imp.cat_sum[col].begin(), imp.cat_sum[col].end()));

            if (prediction_data.categ_data[row + col * prediction_data.nrows] == 0)
            {
                if (imp.cat_sum.empty() || imp.cat_sum[col].empty())
                {
                    prediction_data.categ_data[row + col * prediction_data.nrows] = -1;
                }

                else if (imp.cat_sum[col][0] <= 0)
                {
                    prediction_data.categ_data[row + col * prediction_data.nrows]
                        =
                    imputer.col_modes[col];
                }
            }
        }
    }

    else
    {
        for (size_t ix = 0; ix < imp.n_missing_cat; ix++)
        {
            col = imp.missing_cat[ix];
            prediction_data.categ_data[col + row * imputer.ncols_categ]
                        =
            std::distance(imp.cat_sum[col].begin(),
                          std::max_element(imp.cat_sum[col].begin(), imp.cat_sum[col].end()));

            if (prediction_data.categ_data[col + row * imputer.ncols_categ] == 0)
            {
                if (imp.cat_sum.empty() || imp.cat_sum[col].empty())
                {
                    prediction_data.categ_data[col + row * imputer.ncols_categ] = -1;
                }
                
                else if (imp.cat_sum[col][0] <= 0)
                {
                    prediction_data.categ_data[col + row * imputer.ncols_categ]
                        =
                    imputer.col_modes[col];
                }
            }
        }
    }
}